

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

String * kj::heapString(String *__return_storage_ptr__,char *value,size_t size)

{
  size_t elementCount;
  char *__dest;
  
  elementCount = size + 1;
  __dest = (char *)_::HeapArrayDisposer::allocateImpl
                             (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
  if (size != 0) {
    memcpy(__dest,value,size);
  }
  __dest[size] = '\0';
  (__return_storage_ptr__->content).ptr = __dest;
  (__return_storage_ptr__->content).size_ = elementCount;
  (__return_storage_ptr__->content).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

String heapString(const char* value, size_t size) {
  char* buffer = _::HeapArrayDisposer::allocate<char>(size + 1);
  if (size != 0u) {
    memcpy(buffer, value, size);
  }
  buffer[size] = '\0';
  return String(buffer, size, _::HeapArrayDisposer::instance);
}